

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O0

void rpc_tests::rpc_format_monetary_values_invoker(void)

{
  basic_wrap_stringstream<char> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  basic_wrap_stringstream<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  long in_FS_OFFSET;
  rpc_format_monetary_values t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff1a8;
  std_string *in_stack_fffffffffffff1b0;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff1b8;
  const_string *in_stack_fffffffffffff1d0;
  const_string *msg;
  size_t in_stack_fffffffffffff1d8;
  size_t line_num;
  const_string *in_stack_fffffffffffff1e0;
  unit_test_log_t *in_stack_fffffffffffff1e8;
  const_string local_c88 [25];
  undefined1 local_af0 [408];
  undefined1 local_958 [408];
  undefined1 local_7c0 [408];
  rpc_format_monetary_values local_628;
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,
             (pointer)in_stack_fffffffffffff1b0,(unsigned_long)in_stack_fffffffffffff1a8);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1a8);
  boost::operator<<(in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [27])in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [15])in_stack_fffffffffffff1b0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1b8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1e8,in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8,
             in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  rpc_format_monetary_values::rpc_format_monetary_values
            ((rpc_format_monetary_values *)in_stack_fffffffffffff1a8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,
             (pointer)in_stack_fffffffffffff1b0,(unsigned_long)in_stack_fffffffffffff1a8);
  memset(local_7c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1a8);
  boost::operator<<(in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [27])in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [16])in_stack_fffffffffffff1b0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1b8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1e8,in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8,
             in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::unit_test::setup_conditional<rpc_tests::rpc_format_monetary_values>
            ((rpc_format_monetary_values *)0x9927f0);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,
             (pointer)in_stack_fffffffffffff1b0,(unsigned_long)in_stack_fffffffffffff1a8);
  memset(local_958,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1a8);
  boost::operator<<(in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [27])in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [13])in_stack_fffffffffffff1b0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1b8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1e8,in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8,
             in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  rpc_format_monetary_values::test_method(&local_628);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,
             (pointer)in_stack_fffffffffffff1b0,(unsigned_long)in_stack_fffffffffffff1a8);
  memset(local_af0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1a8);
  boost::operator<<(in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [27])in_stack_fffffffffffff1b0);
  this = boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [19])in_stack_fffffffffffff1b0);
  file = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1b8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,in_stack_fffffffffffff1d8,
             in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::unit_test::teardown_conditional<rpc_tests::rpc_format_monetary_values>
            ((rpc_format_monetary_values *)0x992a16);
  line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,
             (pointer)in_stack_fffffffffffff1b0,(unsigned_long)in_stack_fffffffffffff1a8);
  msg = local_c88;
  memset(msg,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1a8);
  boost::operator<<(in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [27])in_stack_fffffffffffff1b0);
  this_00 = boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [15])in_stack_fffffffffffff1b0);
  s = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this_00);
  boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00,s)
  ;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,line_num,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  rpc_format_monetary_values::~rpc_format_monetary_values
            ((rpc_format_monetary_values *)in_stack_fffffffffffff1a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_format_monetary_values)
{
    BOOST_CHECK(ValueFromAmount(0LL).write() == "0.00000000");
    BOOST_CHECK(ValueFromAmount(1LL).write() == "0.00000001");
    BOOST_CHECK(ValueFromAmount(17622195LL).write() == "0.17622195");
    BOOST_CHECK(ValueFromAmount(50000000LL).write() == "0.50000000");
    BOOST_CHECK(ValueFromAmount(89898989LL).write() == "0.89898989");
    BOOST_CHECK(ValueFromAmount(100000000LL).write() == "1.00000000");
    BOOST_CHECK(ValueFromAmount(2099999999999990LL).write() == "20999999.99999990");
    BOOST_CHECK(ValueFromAmount(2099999999999999LL).write() == "20999999.99999999");

    BOOST_CHECK_EQUAL(ValueFromAmount(0).write(), "0.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount((COIN/10000)*123456789).write(), "12345.67890000");
    BOOST_CHECK_EQUAL(ValueFromAmount(-COIN).write(), "-1.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(-COIN/10).write(), "-0.10000000");

    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*100000000).write(), "100000000.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*10000000).write(), "10000000.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*1000000).write(), "1000000.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*100000).write(), "100000.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*10000).write(), "10000.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*1000).write(), "1000.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*100).write(), "100.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*10).write(), "10.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN).write(), "1.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/10).write(), "0.10000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/100).write(), "0.01000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/1000).write(), "0.00100000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/10000).write(), "0.00010000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/100000).write(), "0.00001000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/1000000).write(), "0.00000100");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/10000000).write(), "0.00000010");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/100000000).write(), "0.00000001");

    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::max()).write(), "92233720368.54775807");
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::max() - 1).write(), "92233720368.54775806");
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::max() - 2).write(), "92233720368.54775805");
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::max() - 3).write(), "92233720368.54775804");
    // ...
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::min() + 3).write(), "-92233720368.54775805");
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::min() + 2).write(), "-92233720368.54775806");
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::min() + 1).write(), "-92233720368.54775807");
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::min()).write(), "-92233720368.54775808");
}